

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf_tap(cm_printf_type type,uint32_t test_number,char *test_name,char *error_message)

{
  char *pcVar1;
  char *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  undefined4 in_EDI;
  char *q;
  char *p;
  char *msg;
  char *local_28;
  
  switch(in_EDI) {
  case 0:
    break;
  case 1:
    print_message("ok %u - %s\n",(ulong)in_ESI,in_RDX);
    break;
  case 2:
    print_message("not ok %u - %s\n",(ulong)in_ESI,in_RDX);
    if ((in_RCX != (char *)0x0) && (local_28 = strdup(in_RCX), local_28 != (char *)0x0)) {
      while (*local_28 != '\0') {
        pcVar1 = strchr(local_28,10);
        if (pcVar1 != (char *)0x0) {
          *pcVar1 = '\0';
        }
        print_message("# %s\n",local_28);
        if (pcVar1 == (char *)0x0) break;
        local_28 = pcVar1 + 1;
      }
      libc_free((void *)0x187768);
    }
    break;
  case 3:
    print_message("not ok %u - %s %s\n",(ulong)in_ESI,in_RDX,in_RCX);
    break;
  case 4:
    print_message("not ok %u # SKIP %s\n",(ulong)in_ESI,in_RDX);
  }
  return;
}

Assistant:

static void cmprintf_tap(enum cm_printf_type type,
                         uint32_t test_number,
                         const char *test_name,
                         const char *error_message)
{
    switch (type) {
    case PRINTF_TEST_START:
        break;
    case PRINTF_TEST_SUCCESS:
        print_message("ok %u - %s\n", (unsigned)test_number, test_name);
        break;
    case PRINTF_TEST_FAILURE:
        print_message("not ok %u - %s\n", (unsigned)test_number, test_name);
        if (error_message != NULL) {
            char *msg;
            char *p;

            msg = strdup(error_message);
            if (msg == NULL) {
                return;
            }
            p = msg;

            while (p[0] != '\0') {
                char *q = p;

                p = strchr(q, '\n');
                if (p != NULL) {
                    p[0] = '\0';
                }

                print_message("# %s\n", q);

                if (p == NULL) {
                    break;
                }
                p++;
            }
            libc_free(msg);
        }
        break;
    case PRINTF_TEST_SKIPPED:
        print_message("not ok %u # SKIP %s\n", (unsigned)test_number, test_name);
        break;
    case PRINTF_TEST_ERROR:
        print_message("not ok %u - %s %s\n",
                      (unsigned)test_number, test_name, error_message);
        break;
    }
}